

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateExtension
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  uint uVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  GeneratorOptions *pGVar5;
  Descriptor *pDVar6;
  char *pcVar7;
  string *value1;
  int i;
  int i_00;
  int i_01;
  BytesMode in_stack_fffffffffffffb80;
  char *local_380;
  string local_328;
  string local_308;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  byte local_29b;
  allocator local_29a;
  byte local_299;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  byte local_253;
  allocator local_252;
  byte local_251;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  allocator local_169;
  string local_168;
  byte local_143;
  allocator local_142;
  byte local_141;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  byte local_fa;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_68;
  undefined1 local_48 [8];
  string extension_scope;
  FieldDescriptor *field_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  extension_scope.field_2._8_8_ = field;
  pDVar4 = FieldDescriptor::extension_scope(field);
  if (pDVar4 == (Descriptor *)0x0) {
    pGVar5 = (GeneratorOptions *)
             FieldDescriptor::file((FieldDescriptor *)extension_scope.field_2._8_8_);
    (anonymous_namespace)::GetFilePath_abi_cxx11_
              ((string *)local_48,(_anonymous_namespace_ *)options,pGVar5,(FileDescriptor *)field);
  }
  else {
    pGVar5 = (GeneratorOptions *)
             FieldDescriptor::extension_scope((FieldDescriptor *)extension_scope.field_2._8_8_);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              ((string *)local_48,(_anonymous_namespace_ *)options,pGVar5,(Descriptor *)field);
  }
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_68,(_anonymous_namespace_ *)options,
             (GeneratorOptions *)extension_scope.field_2._8_8_,field);
  (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
            (&local_98,(_anonymous_namespace_ *)options,
             (GeneratorOptions *)extension_scope.field_2._8_8_,(FieldDescriptor *)0x0,true,false,
             false,in_stack_fffffffffffffb80);
  value1 = &local_68;
  io::Printer::Print(printer,
                     "\n/**\n * A tuple of {field number, class constructor} for the extension\n * field named `$name$`.\n * @type {!jspb.ExtensionFieldInfo.<$extensionType$>}\n */\n$class$.$name$ = new jspb.ExtensionFieldInfo(\n"
                     ,"name",value1,"class",(string *)local_48,"extensionType",&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_68);
  uVar2 = FieldDescriptor::number((FieldDescriptor *)extension_scope.field_2._8_8_);
  SimpleItoa_abi_cxx11_(&local_b8,(protobuf *)(ulong)uVar2,i);
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_d8,(_anonymous_namespace_ *)options,
             (GeneratorOptions *)extension_scope.field_2._8_8_,(FieldDescriptor *)value1);
  local_fa = 0;
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)extension_scope.field_2._8_8_);
  if (CVar3 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_f8,(_anonymous_namespace_ *)options,
               (GeneratorOptions *)extension_scope.field_2._8_8_,(FieldDescriptor *)value1);
  }
  else {
    std::allocator<char>::allocator();
    local_fa = 1;
    std::__cxx11::string::string((string *)&local_f8,"null",&local_f9);
  }
  local_141 = 0;
  local_143 = 0;
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)extension_scope.field_2._8_8_);
  if (CVar3 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_140,(_anonymous_namespace_ *)options,
               (GeneratorOptions *)extension_scope.field_2._8_8_,(FieldDescriptor *)value1);
    local_141 = 1;
    std::operator+(&local_120,&local_140,".toObject");
  }
  else {
    std::allocator<char>::allocator();
    local_143 = 1;
    std::__cxx11::string::string((string *)&local_120,"null",&local_142);
  }
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)extension_scope.field_2._8_8_);
  if (bVar1) {
    local_380 = ", 1";
  }
  else {
    local_380 = ", 0";
  }
  local_380 = local_380 + 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,local_380,&local_169);
  pDVar4 = (Descriptor *)0x5dd967;
  io::Printer::Print(printer,
                     "    $index$,\n    {$name$: 0},\n    $ctor$,\n     /** @type {?function((boolean|undefined),!jspb.Message=): !Object} */ (\n         $toObject$),\n    $repeated$);\n"
                     ,"index",&local_b8,"name",&local_d8,"ctor",&local_f8,"toObject",&local_120,
                     "repeated",&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string((string *)&local_120);
  if ((local_143 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_142);
  }
  if ((local_141 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_140);
  }
  std::__cxx11::string::~string((string *)&local_f8);
  if ((local_fa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  pGVar5 = (GeneratorOptions *)
           FieldDescriptor::file((FieldDescriptor *)extension_scope.field_2._8_8_);
  pDVar6 = FieldDescriptor::containing_type((FieldDescriptor *)extension_scope.field_2._8_8_);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            (&local_190,(_anonymous_namespace_ *)options,pGVar5,(FileDescriptor *)pDVar6,pDVar4);
  uVar2 = FieldDescriptor::number((FieldDescriptor *)extension_scope.field_2._8_8_);
  SimpleItoa_abi_cxx11_(&local_1b0,(protobuf *)(ulong)uVar2,i_00);
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_1d0,(_anonymous_namespace_ *)options,
             (GeneratorOptions *)extension_scope.field_2._8_8_,(FieldDescriptor *)pDVar6);
  (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
            (&local_1f0,(_anonymous_namespace_ *)options,
             (GeneratorOptions *)extension_scope.field_2._8_8_,(FieldDescriptor *)pDVar6);
  (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
            (&local_210,(_anonymous_namespace_ *)options,
             (GeneratorOptions *)extension_scope.field_2._8_8_,(FieldDescriptor *)pDVar6);
  local_251 = 0;
  local_253 = 0;
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)extension_scope.field_2._8_8_);
  if (CVar3 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_250,(_anonymous_namespace_ *)options,
               (GeneratorOptions *)extension_scope.field_2._8_8_,(FieldDescriptor *)pDVar6);
    local_251 = 1;
    std::operator+(&local_230,&local_250,".serializeBinaryToWriter");
  }
  else {
    std::allocator<char>::allocator();
    local_253 = 1;
    std::__cxx11::string::string((string *)&local_230,"undefined",&local_252);
  }
  local_299 = 0;
  local_29b = 0;
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)extension_scope.field_2._8_8_);
  if (CVar3 == CPPTYPE_MESSAGE) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_298,(_anonymous_namespace_ *)options,
               (GeneratorOptions *)extension_scope.field_2._8_8_,(FieldDescriptor *)pDVar6);
    local_299 = 1;
    std::operator+(&local_278,&local_298,".deserializeBinaryFromReader");
  }
  else {
    std::allocator<char>::allocator();
    local_29b = 1;
    std::__cxx11::string::string((string *)&local_278,"undefined",&local_29a);
  }
  pDVar4 = (Descriptor *)0x5e2c00;
  io::Printer::Print(printer,
                     "\n$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n    $class$.$name$,\n    $binaryReaderFn$,\n    $binaryWriterFn$,\n    $binaryMessageSerializeFn$,\n    $binaryMessageDeserializeFn$,\n"
                     ,"extendName",&local_190,"index",&local_1b0,"class",(string *)local_48,"name",
                     &local_1d0,"binaryReaderFn",&local_1f0,"binaryWriterFn",&local_210,
                     "binaryMessageSerializeFn",&local_230,"binaryMessageDeserializeFn",&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  if ((local_29b & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_29a);
  }
  if ((local_299 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_298);
  }
  std::__cxx11::string::~string((string *)&local_230);
  if ((local_253 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_252);
  }
  if ((local_251 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_250);
  }
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  bVar1 = FieldDescriptor::is_packed((FieldDescriptor *)extension_scope.field_2._8_8_);
  pcVar7 = "false";
  if (bVar1) {
    pcVar7 = "true";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,pcVar7,&local_2c1);
  io::Printer::Print(printer,"    $isPacked$);\n","isPacked",&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  pGVar5 = (GeneratorOptions *)
           FieldDescriptor::file((FieldDescriptor *)extension_scope.field_2._8_8_);
  pDVar6 = FieldDescriptor::containing_type((FieldDescriptor *)extension_scope.field_2._8_8_);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            (&local_2e8,(_anonymous_namespace_ *)options,pGVar5,(FileDescriptor *)pDVar6,pDVar4);
  uVar2 = FieldDescriptor::number((FieldDescriptor *)extension_scope.field_2._8_8_);
  SimpleItoa_abi_cxx11_(&local_308,(protobuf *)(ulong)uVar2,i_01);
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_328,(_anonymous_namespace_ *)options,
             (GeneratorOptions *)extension_scope.field_2._8_8_,(FieldDescriptor *)pDVar6);
  io::Printer::Print(printer,
                     "// This registers the extension field with the extended class, so that\n// toObject() will function correctly.\n$extendName$[$index$] = $class$.$name$;\n\n"
                     ,"extendName",&local_2e8,"index",&local_308,"class",(string *)local_48,"name",
                     &local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Generator::GenerateExtension(const GeneratorOptions& options,
                                  io::Printer* printer,
                                  const FieldDescriptor* field) const {
  string extension_scope =
      (field->extension_scope()
           ? GetMessagePath(options, field->extension_scope())
           : GetFilePath(options, field->file()));

  printer->Print(
      "\n"
      "/**\n"
      " * A tuple of {field number, class constructor} for the extension\n"
      " * field named `$name$`.\n"
      " * @type {!jspb.ExtensionFieldInfo.<$extensionType$>}\n"
      " */\n"
      "$class$.$name$ = new jspb.ExtensionFieldInfo(\n",
      "name", JSObjectFieldName(options, field),
      "class", extension_scope,
      "extensionType", JSFieldTypeAnnotation(
          options, field,
          /* is_setter_argument = */ false,
          /* force_present = */ true,
          /* singular_if_not_packed = */ false));
  printer->Print(
      "    $index$,\n"
      "    {$name$: 0},\n"
      "    $ctor$,\n"
      "     /** @type {?function((boolean|undefined),!jspb.Message=): "
      "!Object} */ (\n"
      "         $toObject$),\n"
      "    $repeated$);\n",
      "index", SimpleItoa(field->number()),
      "name", JSObjectFieldName(options, field),
      "ctor", (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ?
               SubmessageTypeRef(options, field) : string("null")),
      "toObject", (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ?
                   (SubmessageTypeRef(options, field) + ".toObject") :
                   string("null")),
      "repeated", (field->is_repeated() ? "1" : "0"));

  printer->Print(
      "\n"
      "$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n"
      "    $class$.$name$,\n"
      "    $binaryReaderFn$,\n"
      "    $binaryWriterFn$,\n"
      "    $binaryMessageSerializeFn$,\n"
      "    $binaryMessageDeserializeFn$,\n",
      "extendName",
      JSExtensionsObjectName(options, field->file(), field->containing_type()),
      "index", SimpleItoa(field->number()), "class", extension_scope, "name",
      JSObjectFieldName(options, field), "binaryReaderFn",
      JSBinaryReaderMethodName(options, field), "binaryWriterFn",
      JSBinaryWriterMethodName(options, field), "binaryMessageSerializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".serializeBinaryToWriter")
          : "undefined",
      "binaryMessageDeserializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".deserializeBinaryFromReader")
          : "undefined");

  printer->Print("    $isPacked$);\n", "isPacked",
                 (field->is_packed() ? "true" : "false"));

  printer->Print(
      "// This registers the extension field with the extended class, so that\n"
      "// toObject() will function correctly.\n"
      "$extendName$[$index$] = $class$.$name$;\n"
      "\n",
      "extendName", JSExtensionsObjectName(options, field->file(),
                                           field->containing_type()),
      "index", SimpleItoa(field->number()),
      "class", extension_scope,
      "name", JSObjectFieldName(options, field));
}